

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_pointer
              (sqlite3_stmt *pStmt,int i,void *pPtr,char *zPTtype,_func_void_void_ptr *xDestructor)

{
  int iVar1;
  char *in_RCX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  Vdbe *in_R8;
  Vdbe *p;
  int rc;
  int in_stack_ffffffffffffffd4;
  
  iVar1 = vdbeUnbind(in_R8,in_stack_ffffffffffffffd4);
  if (iVar1 == 0) {
    sqlite3VdbeMemSetPointer
              ((Mem *)(*(long *)(in_RDI + 0xa0) + (long)(in_ESI + -1) * 0x38),in_RDX,in_RCX,
               (_func_void_void_ptr *)in_R8);
    sqlite3_mutex_leave((sqlite3_mutex *)0x13670c);
  }
  else if (in_R8 != (Vdbe *)0x0) {
    (*(code *)in_R8)(in_RDX);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_pointer(
  sqlite3_stmt *pStmt,
  int i,
  void *pPtr,
  const char *zPTtype,
  void (*xDestructor)(void*)
){
  int rc;
  Vdbe *p = (Vdbe*)pStmt;
  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    sqlite3VdbeMemSetPointer(&p->aVar[i-1], pPtr, zPTtype, xDestructor);
    sqlite3_mutex_leave(p->db->mutex);
  }else if( xDestructor ){
    xDestructor(pPtr);
  }
  return rc;
}